

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O3

int mbedtls_ssl_ticket_parse(void *p_ticket,mbedtls_ssl_session *session,uchar *buf,size_t len)

{
  uchar *input;
  bool bVar1;
  int iVar2;
  size_t in_RAX;
  time_t tVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong ilen;
  size_t clear_len;
  
  iVar5 = -0x7100;
  iVar2 = iVar5;
  if ((((p_ticket != (void *)0x0) && (0x21 < len)) && (*(long *)((long)p_ticket + 200) != 0)) &&
     ((clear_len = in_RAX, iVar2 = ssl_ticket_update_keys((mbedtls_ssl_ticket_context *)p_ticket),
      iVar2 == 0 &&
      (ilen = (ulong)(ushort)(*(ushort *)(buf + 0x10) << 8 | *(ushort *)(buf + 0x10) >> 8),
      iVar2 = iVar5, ilen + 0x22 == len)))) {
    input = buf + 0x12;
    lVar6 = 0;
    iVar2 = -0x6d80;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      if (*(int *)buf == *(int *)((long)p_ticket + lVar6 * 0x60)) {
        iVar2 = mbedtls_cipher_auth_decrypt
                          ((mbedtls_cipher_context_t *)((long)p_ticket + lVar6 * 0x60 + 8),buf + 4,
                           0xc,buf,0x12,input,ilen,input,&clear_len,input + ilen,0x10);
        if (iVar2 != 0) {
          if (iVar2 == -0x6300) {
            return -0x7180;
          }
          return iVar2;
        }
        if (clear_len != ilen) {
          return -0x6c00;
        }
        iVar2 = ssl_load_session(session,input,ilen);
        if (iVar2 != 0) {
          return iVar2;
        }
        tVar3 = time((time_t *)0x0);
        if (tVar3 < session->start) {
          return -0x6d80;
        }
        if ((uint)((int)tVar3 - (int)session->start) <= *(uint *)((long)p_ticket + 0xc4)) {
          return 0;
        }
        return -0x6d80;
      }
      lVar6 = 1;
      bVar1 = false;
    } while (bVar4);
  }
  return iVar2;
}

Assistant:

int mbedtls_ssl_ticket_parse( void *p_ticket,
                              mbedtls_ssl_session *session,
                              unsigned char *buf,
                              size_t len )
{
    int ret;
    mbedtls_ssl_ticket_context *ctx = p_ticket;
    mbedtls_ssl_ticket_key *key;
    unsigned char *key_name = buf;
    unsigned char *iv = buf + 4;
    unsigned char *enc_len_p = iv + 12;
    unsigned char *ticket = enc_len_p + 2;
    unsigned char *tag;
    size_t enc_len, clear_len;

    if( ctx == NULL || ctx->f_rng == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    /* See mbedtls_ssl_ticket_write() */
    if( len < 4 + 12 + 2 + 16 )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    if( ( ret = ssl_ticket_update_keys( ctx ) ) != 0 )
        goto cleanup;

    enc_len = ( enc_len_p[0] << 8 ) | enc_len_p[1];
    tag = ticket + enc_len;

    if( len != 4 + 12 + 2 + enc_len + 16 )
    {
        ret = MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
        goto cleanup;
    }

    /* Select key */
    if( ( key = ssl_ticket_select_key( ctx, key_name ) ) == NULL )
    {
        /* We can't know for sure but this is a likely option unless we're
         * under attack - this is only informative anyway */
        ret = MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED;
        goto cleanup;
    }

    /* Decrypt and authenticate */
    if( ( ret = mbedtls_cipher_auth_decrypt( &key->ctx, iv, 12,
                    key_name, 4 + 12 + 2, ticket, enc_len,
                    ticket, &clear_len, tag, 16 ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_CIPHER_AUTH_FAILED )
            ret = MBEDTLS_ERR_SSL_INVALID_MAC;

        goto cleanup;
    }
    if( clear_len != enc_len )
    {
        ret = MBEDTLS_ERR_SSL_INTERNAL_ERROR;
        goto cleanup;
    }

    /* Actually load session */
    if( ( ret = ssl_load_session( session, ticket, clear_len ) ) != 0 )
        goto cleanup;

#if defined(MBEDTLS_HAVE_TIME)
    {
        /* Check for expiration */
        mbedtls_time_t current_time = mbedtls_time( NULL );

        if( current_time < session->start ||
            (uint32_t)( current_time - session->start ) > ctx->ticket_lifetime )
        {
            ret = MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED;
            goto cleanup;
        }
    }
#endif

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}